

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O3

RGB __thiscall
pbrt::PixelSensor::ToSensorRGB(PixelSensor *this,SampledSpectrum *s,SampledWavelengths *lambda)

{
  undefined1 auVar1 [16];
  int i;
  long lVar2;
  undefined1 auVar3 [16];
  Float sum;
  float fVar4;
  float fVar5;
  undefined1 in_ZMM0 [64];
  undefined1 auVar9 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  Float sum_1;
  float fVar10;
  undefined1 in_ZMM1 [64];
  undefined1 auVar14 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  RGB RVar15;
  SampledSpectrum SVar16;
  float local_48 [4];
  float local_38 [4];
  float local_28 [4];
  
  auVar14 = in_ZMM1._8_56_;
  auVar9 = in_ZMM0._8_56_;
  SVar16 = DenselySampledSpectrum::Sample(&this->r_bar,lambda);
  auVar11._0_8_ = SVar16.values.values._8_8_;
  auVar11._8_56_ = auVar14;
  auVar6._0_8_ = SVar16.values.values._0_8_;
  auVar6._8_56_ = auVar9;
  auVar3 = vmovlhps_avx(auVar6._0_16_,auVar11._0_16_);
  local_28[0] = auVar3._0_4_ * (s->values).values[0];
  lVar2 = 1;
  local_28[1] = auVar3._4_4_ * (s->values).values[1];
  local_28[2] = auVar3._8_4_ * (s->values).values[2];
  local_28[3] = auVar3._12_4_ * (s->values).values[3];
  fVar4 = local_28[0];
  do {
    fVar4 = fVar4 + local_28[lVar2];
    auVar9 = (undefined1  [56])0x0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  SVar16 = DenselySampledSpectrum::Sample(&this->g_bar,lambda);
  auVar12._0_8_ = SVar16.values.values._8_8_;
  auVar12._8_56_ = auVar14;
  auVar7._0_8_ = SVar16.values.values._0_8_;
  auVar7._8_56_ = auVar9;
  auVar3 = vmovlhps_avx(auVar7._0_16_,auVar12._0_16_);
  local_38[0] = auVar3._0_4_ * (s->values).values[0];
  lVar2 = 1;
  local_38[1] = auVar3._4_4_ * (s->values).values[1];
  local_38[2] = auVar3._8_4_ * (s->values).values[2];
  local_38[3] = auVar3._12_4_ * (s->values).values[3];
  fVar5 = local_38[0];
  do {
    fVar5 = fVar5 + local_38[lVar2];
    auVar9 = (undefined1  [56])0x0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  SVar16 = DenselySampledSpectrum::Sample(&this->b_bar,lambda);
  auVar13._0_8_ = SVar16.values.values._8_8_;
  auVar13._8_56_ = auVar14;
  auVar8._0_8_ = SVar16.values.values._0_8_;
  auVar8._8_56_ = auVar9;
  auVar3 = vmovlhps_avx(auVar8._0_16_,auVar13._0_16_);
  fVar10 = auVar3._0_4_ * (s->values).values[0];
  lVar2 = 1;
  local_48[1] = auVar3._4_4_ * (s->values).values[1];
  local_48[2] = auVar3._8_4_ * (s->values).values[2];
  local_48[3] = auVar3._12_4_ * (s->values).values[3];
  do {
    fVar10 = fVar10 + local_48[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  auVar3 = vinsertps_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar5),0x10);
  auVar1._8_4_ = 0x3e800000;
  auVar1._0_8_ = 0x3e8000003e800000;
  auVar1._12_4_ = 0x3e800000;
  auVar3 = vmulps_avx512vl(auVar3,auVar1);
  RVar15._0_8_ = auVar3._0_8_;
  RVar15.b = fVar10 * 0.25;
  return RVar15;
}

Assistant:

PBRT_CPU_GPU
    RGB ToSensorRGB(const SampledSpectrum &s, const SampledWavelengths &lambda) const {
        return RGB((r_bar.Sample(lambda) * s).Average(),
                      (g_bar.Sample(lambda) * s).Average(),
                      (b_bar.Sample(lambda) * s).Average());
    }